

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseSkeletonSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  byte *__s2;
  SMDImporter *this_00;
  int iTime;
  byte *local_48;
  int local_3c;
  char **local_38;
  
  local_3c = 0;
  local_48 = (byte *)szCurrent;
  local_38 = szCurrentOut;
  do {
    this->iLineNumber = this->iLineNumber + 1;
    __s2 = local_48;
    while (((ulong)*__s2 < 0x21 && ((0x100002600U >> ((ulong)*__s2 & 0x3f) & 1) != 0))) {
      __s2 = __s2 + 1;
    }
    local_48 = __s2;
    if (*__s2 == 0) goto LAB_0062704c;
    iVar4 = strncmp("end",(char *)__s2,3);
    pbVar2 = local_48;
    if (iVar4 == 0) {
      bVar1 = __s2[3];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        local_48 = __s2 + (4 - (ulong)(bVar1 == 0));
LAB_0062704c:
        *local_38 = (char *)local_48;
        return;
      }
    }
    this_00 = (SMDImporter *)0x7886dd;
    iVar4 = strncmp("time",(char *)local_48,4);
    if (iVar4 == 0) {
      bVar1 = pbVar2[4];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_00626f98;
      local_48 = pbVar2 + 5;
      if (bVar1 == 0) {
        local_48 = pbVar2 + 4;
      }
      bVar3 = ParseSignedInt(this_00,(char *)local_48,(char **)&local_48,&local_3c);
      if (!bVar3) goto LAB_0062704c;
      iVar4 = this->iSmallestFrame;
      if (local_3c < this->iSmallestFrame) {
        iVar4 = local_3c;
      }
      this->iSmallestFrame = iVar4;
      while ((0xd < *local_48 || ((0x2401U >> (*local_48 & 0x1f) & 1) == 0))) {
        local_48 = local_48 + 1;
      }
      for (; (*local_48 == 0xd || (*local_48 == 10)); local_48 = local_48 + 1) {
      }
      this->iLineNumber = this->iLineNumber + 1;
    }
    else {
LAB_00626f98:
      ParseSkeletonElement(this,(char *)local_48,(char **)&local_48,local_3c);
    }
  } while( true );
}

Assistant:

void SMDImporter::ParseSkeletonSection(const char* szCurrent, const char** szCurrentOut) {
    int iTime = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the skeleton section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        } else if (TokenMatch(szCurrent,"time",4)) {
        // "time <n>\n" - Specifies the current animation frame
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime)) {
                break;
            }

            iSmallestFrame = std::min(iSmallestFrame,iTime);
            SkipLine(szCurrent,&szCurrent);
        } else {
            ParseSkeletonElement(szCurrent,&szCurrent,iTime);
        }
    }
    *szCurrentOut = szCurrent;
}